

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

handle pybind11::detail::type_caster<char,_void>::cast
                 (char *src,return_value_policy policy,handle parent)

{
  handle hVar1;
  allocator local_39;
  StringType local_38;
  
  if (src == (char *)0x0) {
    hVar1.m_ptr = (PyObject *)&_Py_NoneStruct;
    local_38._M_dataplus._M_p = &_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 2;
    pybind11::object::~object((object *)&local_38);
  }
  else {
    std::__cxx11::string::string((string *)&local_38,src,&local_39);
    hVar1 = type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
            ::cast(&local_38,policy,parent);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return (handle)hVar1.m_ptr;
}

Assistant:

static handle cast(const CharT *src, return_value_policy policy, handle parent) {
        if (src == nullptr) return pybind11::none().inc_ref();
        return StringCaster::cast(StringType(src), policy, parent);
    }